

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  server_t s;
  allocator<char> local_35a;
  allocator<char> local_359;
  string local_358;
  string local_338;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  server_t local_2f0;
  
  clask::server_t::server_t(&local_2f0);
  clask::logger::default_level = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"/",&local_359);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"./public",&local_35a);
  clask::server_t::static_dir(&local_2f0,&local_358,&local_338,false);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"/api",(allocator<char> *)&local_338);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/static/main.cxx:7:17)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/static/main.cxx:7:17)>
              ::_M_manager;
  clask::server_t::GET(&local_2f0,&local_358,(functor_writer *)&local_318);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  std::__cxx11::string::~string((string *)&local_358);
  clask::server_t::run(&local_2f0,0x1f90);
  clask::server_t::~server_t(&local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/", "./public");
  s.GET("/api", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "application/json");
    time_t t;
    struct tm* tm;
    std::time(&t);
    tm = std::gmtime(&t);
    std::stringstream date;
    date <<  R"({"time": ")"
      << std::put_time(tm, "%a, %d %B %Y %H:%M:%S GMT")
      << R"("})";
    resp.write(date.str());
    resp.end();
  });
  s.run();
}